

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::internal::UnitTestImpl::ListTestsMatchingFilter(UnitTestImpl *this)

{
  pointer ppTVar1;
  TestSuite *pTVar2;
  pointer ppTVar3;
  TestInfo *pTVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  __uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var6;
  bool bVar7;
  pointer ppTVar8;
  FILE *__stream;
  size_t j;
  ulong uVar9;
  int iVar10;
  _Alloc_hider str;
  char *str_00;
  char *local_220 [4];
  XmlUnitTestResultPrinter local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream stream;
  ostream local_1a8 [376];
  
  ppTVar1 = (this->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar8 = (this->test_suites_).
                 super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppTVar8 != ppTVar1; ppTVar8 = ppTVar8 + 1
      ) {
    pTVar2 = *ppTVar8;
    uVar9 = 0;
    bVar7 = false;
    while( true ) {
      ppTVar3 = (pTVar2->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pTVar2->test_info_list_).
                        super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >> 3) <= uVar9)
      break;
      pTVar4 = ppTVar3[uVar9];
      if (pTVar4->matches_filter_ == true) {
        if (!bVar7) {
          printf("%s.",(pTVar2->name_)._M_dataplus._M_p);
          pbVar5 = (pTVar2->type_param_)._M_t.
                   super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
          if ((pbVar5 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
             && ((pbVar5->_M_dataplus)._M_p != (pointer)0x0)) {
            iVar10 = 0x1340f2;
            printf("  # %s = ");
            pbVar5 = (pTVar2->type_param_)._M_t.
                     super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
            if (pbVar5 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
            {
              str._M_p = (char *)0x0;
            }
            else {
              str._M_p = (pbVar5->_M_dataplus)._M_p;
            }
            PrintOnOneLine(str._M_p,iVar10);
          }
          putchar(10);
        }
        printf("  %s",(pTVar4->name_)._M_dataplus._M_p);
        _Var6._M_t.
        super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (pTVar4->value_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t;
        if (((_Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )_Var6._M_t.
               super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl !=
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
           (*(long *)_Var6._M_t.
                     super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl != 0)) {
          iVar10 = 0x134158;
          printf("  # %s = ");
          _Var6._M_t.
          super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (pTVar4->value_param_)._M_t.
               super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t;
          if ((_Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )_Var6._M_t.
                super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            str_00 = (char *)0x0;
          }
          else {
            str_00 = *(char **)_Var6._M_t.
                               super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          PrintOnOneLine(str_00,iVar10);
        }
        putchar(10);
        bVar7 = true;
      }
      uVar9 = uVar9 + 1;
    }
  }
  fflush(_stdout);
  UnitTestOptions::GetOutputFormat_abi_cxx11_();
  bVar7 = std::operator==(&local_1d8,"xml");
  if (!bVar7) {
    bVar7 = std::operator==(&local_1d8,"json");
    if (!bVar7) goto LAB_00125ac4;
  }
  UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
  __stream = (FILE *)OpenFileForWriting((string *)&stream);
  std::__cxx11::string::~string((string *)&stream);
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  bVar7 = std::operator==(&local_1d8,"xml");
  if (bVar7) {
    UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
    XmlUnitTestResultPrinter::XmlUnitTestResultPrinter(&local_200,local_220[0]);
    XmlUnitTestResultPrinter::PrintXmlTestsList(local_1a8,&this->test_suites_);
    XmlUnitTestResultPrinter::~XmlUnitTestResultPrinter(&local_200);
LAB_00125a7b:
    std::__cxx11::string::~string((string *)local_220);
  }
  else {
    bVar7 = std::operator==(&local_1d8,"json");
    if (bVar7) {
      UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
      JsonUnitTestResultPrinter::JsonUnitTestResultPrinter
                ((JsonUnitTestResultPrinter *)&local_200,local_220[0]);
      JsonUnitTestResultPrinter::PrintJsonTestList(local_1a8,&this->test_suites_);
      JsonUnitTestResultPrinter::~JsonUnitTestResultPrinter((JsonUnitTestResultPrinter *)&local_200)
      ;
      goto LAB_00125a7b;
    }
  }
  StringStreamToString((string *)&local_200,&stream);
  fputs((char *)local_200.super_EmptyTestEventListener.super_TestEventListener.
                _vptr_TestEventListener,__stream);
  std::__cxx11::string::~string((string *)&local_200);
  fclose(__stream);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
LAB_00125ac4:
  std::__cxx11::string::~string((string *)&local_1d8);
  return;
}

Assistant:

void UnitTestImpl::ListTestsMatchingFilter() {
  // Print at most this many characters for each type/value parameter.
  const int kMaxParamLength = 250;

  for (auto* test_suite : test_suites_) {
    bool printed_test_suite_name = false;

    for (size_t j = 0; j < test_suite->test_info_list().size(); j++) {
      const TestInfo* const test_info = test_suite->test_info_list()[j];
      if (test_info->matches_filter_) {
        if (!printed_test_suite_name) {
          printed_test_suite_name = true;
          printf("%s.", test_suite->name());
          if (test_suite->type_param() != nullptr) {
            printf("  # %s = ", kTypeParamLabel);
            // We print the type parameter on a single line to make
            // the output easy to parse by a program.
            PrintOnOneLine(test_suite->type_param(), kMaxParamLength);
          }
          printf("\n");
        }
        printf("  %s", test_info->name());
        if (test_info->value_param() != nullptr) {
          printf("  # %s = ", kValueParamLabel);
          // We print the value parameter on a single line to make the
          // output easy to parse by a program.
          PrintOnOneLine(test_info->value_param(), kMaxParamLength);
        }
        printf("\n");
      }
    }
  }
  fflush(stdout);
#if GTEST_HAS_FILE_SYSTEM
  const std::string& output_format = UnitTestOptions::GetOutputFormat();
  if (output_format == "xml" || output_format == "json") {
    FILE* fileout =
        OpenFileForWriting(UnitTestOptions::GetAbsolutePathToOutputFile());
    std::stringstream stream;
    if (output_format == "xml") {
      XmlUnitTestResultPrinter(
          UnitTestOptions::GetAbsolutePathToOutputFile().c_str())
          .PrintXmlTestsList(&stream, test_suites_);
    } else if (output_format == "json") {
      JsonUnitTestResultPrinter(
          UnitTestOptions::GetAbsolutePathToOutputFile().c_str())
          .PrintJsonTestList(&stream, test_suites_);
    }
    fprintf(fileout, "%s", StringStreamToString(&stream).c_str());
    fclose(fileout);
  }
#endif  // GTEST_HAS_FILE_SYSTEM
}